

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoGenericBoxed::ArchiveIN
          (ChConstraintTwoGenericBoxed *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChConstraintTwoGenericBoxed>(marchive);
  ChConstraintTwoGeneric::ArchiveIN(&this->super_ChConstraintTwoGeneric,marchive);
  local_30._value = &this->l_min;
  local_30._name = "l_min";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->l_max;
  local_48._name = "l_max";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChConstraintTwoGenericBoxed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintTwoGenericBoxed>();

    // deserialize the parent class data too
    ChConstraintTwoGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(l_min);
    marchive >> CHNVP(l_max);
}